

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall google::protobuf::ArenaTest_Alignment_Test::TestBody(ArenaTest_Alignment_Test *this)

{
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_100;
  Voidify local_ed;
  uint local_ec;
  unsigned_long local_e8;
  Nullable<const_char_*> local_e0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *local_c8;
  void *p;
  undefined1 local_b8 [4];
  int i;
  Arena arena;
  ArenaTest_Alignment_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)local_b8);
  p._4_4_ = 0;
  while( true ) {
    if (199 < p._4_4_) {
      Arena::~Arena((Arena *)local_b8);
      return;
    }
    local_c8 = Arena::CreateArray<char>((Arena *)local_b8,(long)p._4_4_);
    local_e8 = absl::lts_20250127::log_internal::GetReferenceableValue((ulong)((uint)local_c8 & 7));
    local_ec = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_e0 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                         (&local_e8,&local_ec,"reinterpret_cast<uintptr_t>(p) % 8 == 0u");
    if (local_e0 != (Nullable<const_char_*>)0x0) break;
    p._4_4_ = p._4_4_ + 1;
    local_e0 = (Nullable<const_char_*>)0x0;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_e0);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
             ,0x6cd,failure_msg);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,p._4_4_);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x20d8522);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_c8);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_ed,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_100)
  ;
}

Assistant:

TEST(ArenaTest, Alignment) {
  Arena arena;
  for (int i = 0; i < 200; i++) {
    void* p = Arena::CreateArray<char>(&arena, i);
    ABSL_CHECK_EQ(reinterpret_cast<uintptr_t>(p) % 8, 0u) << i << ": " << p;
  }
}